

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryMesh(aiMesh *mesh)

{
  uint32_t uVar1;
  size_t sVar2;
  uint *puVar3;
  aiBone *b;
  uint a_2;
  uint16_t local_82;
  uint a_1;
  aiFace *f_1;
  uint local_70;
  uint i_1;
  uint i;
  uint32_t tmp;
  aiFace *f;
  uint local_58;
  uint a;
  uint32_t hash;
  uint local_4c;
  int local_48;
  uint job;
  uint processed;
  uint n_3;
  uint n_2;
  aiVector3D maxVec;
  aiVector3D minVec;
  uint n_1;
  uint n;
  uint c;
  uint32_t old;
  uint32_t len;
  aiMesh *mesh_local;
  
  c = 0;
  _old = mesh;
  n = WriteMagic(0x1237);
  uVar1 = Write<unsigned_int>(&_old->mPrimitiveTypes);
  c = uVar1 + c;
  uVar1 = Write<unsigned_int>(&_old->mNumVertices);
  c = uVar1 + c;
  uVar1 = Write<unsigned_int>(&_old->mNumFaces);
  c = uVar1 + c;
  uVar1 = Write<unsigned_int>(&_old->mNumBones);
  c = uVar1 + c;
  uVar1 = Write<unsigned_int>(&_old->mMaterialIndex);
  c = uVar1 + c;
  n_1 = (uint)(_old->mVertices != (aiVector3D *)0x0);
  if (_old->mNormals != (aiVector3D *)0x0) {
    n_1 = n_1 | 2;
  }
  if ((_old->mTangents != (aiVector3D *)0x0) && (_old->mBitangents != (aiVector3D *)0x0)) {
    n_1 = n_1 | 4;
  }
  for (minVec.z = 0.0;
      ((uint)minVec.z < 8 && (_old->mTextureCoords[(uint)minVec.z] != (aiVector3D *)0x0));
      minVec.z = (float)((int)minVec.z + 1)) {
    n_1 = 0x100 << (SUB41(minVec.z,0) & 0x1f) | n_1;
  }
  for (minVec.y = 0.0; ((uint)minVec.y < 8 && (_old->mColors[(uint)minVec.y] != (aiColor4D *)0x0));
      minVec.y = (float)((int)minVec.y + 1)) {
    n_1 = 0x10000 << (SUB41(minVec.y,0) & 0x1f) | n_1;
  }
  uVar1 = Write<unsigned_int>(&n_1);
  c = uVar1 + c;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&maxVec.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&n_3);
  if (_old->mVertices != (aiVector3D *)0x0) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mVertices,1,(ulong)(_old->mNumVertices * 0xc),(FILE *)out);
      c = (int)sVar2 + c;
    }
    else {
      uVar1 = WriteBounds<aiVector3t<float>>(_old->mVertices,_old->mNumVertices);
      c = uVar1 + c;
    }
  }
  if (_old->mNormals != (aiVector3D *)0x0) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mNormals,1,(ulong)(_old->mNumVertices * 0xc),(FILE *)out);
      c = (int)sVar2 + c;
    }
    else {
      uVar1 = WriteBounds<aiVector3t<float>>(_old->mNormals,_old->mNumVertices);
      c = uVar1 + c;
    }
  }
  if ((_old->mTangents != (aiVector3D *)0x0) && (_old->mBitangents != (aiVector3D *)0x0)) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mTangents,1,(ulong)(_old->mNumVertices * 0xc),(FILE *)out);
      c = (int)sVar2 + c;
      sVar2 = fwrite(_old->mBitangents,1,(ulong)(_old->mNumVertices * 0xc),(FILE *)out);
      c = (int)sVar2 + c;
    }
    else {
      uVar1 = WriteBounds<aiVector3t<float>>(_old->mTangents,_old->mNumVertices);
      c = uVar1 + c;
      uVar1 = WriteBounds<aiVector3t<float>>(_old->mBitangents,_old->mNumVertices);
      c = uVar1 + c;
    }
  }
  for (processed = 0; (processed < 8 && (_old->mColors[processed] != (aiColor4D *)0x0));
      processed = processed + 1) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mColors[processed],(ulong)(_old->mNumVertices << 4),1,(FILE *)out);
      c = (int)sVar2 + c;
    }
    else {
      uVar1 = WriteBounds<aiColor4t<float>>(_old->mColors[processed],_old->mNumVertices);
      c = uVar1 + c;
    }
  }
  for (job = 0; (job < 8 && (_old->mTextureCoords[job] != (aiVector3D *)0x0)); job = job + 1) {
    uVar1 = Write<unsigned_int>(_old->mNumUVComponents + job);
    c = uVar1 + c;
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mTextureCoords[job],(ulong)(_old->mNumVertices * 0xc),1,(FILE *)out);
      c = (int)sVar2 + c;
    }
    else {
      uVar1 = WriteBounds<aiVector3t<float>>(_old->mTextureCoords[job],_old->mNumVertices);
      c = uVar1 + c;
    }
  }
  if ((shortened & 1U) == 0) {
    for (f_1._4_4_ = 0; f_1._4_4_ < _old->mNumFaces; f_1._4_4_ = f_1._4_4_ + 1) {
      _a_1 = _old->mFaces + f_1._4_4_;
      local_82 = (uint16_t)_a_1->mNumIndices;
      uVar1 = Write<unsigned_short>(&local_82);
      c = uVar1 + c;
      for (a_2 = 0; a_2 < _a_1->mNumIndices; a_2 = a_2 + 1) {
        if (_old->mNumVertices < 0x10000) {
          b._6_2_ = (undefined2)_a_1->mIndices[a_2];
          uVar1 = Write<unsigned_short>((uint16_t *)((long)&b + 6));
          c = uVar1 + c;
        }
        else {
          uVar1 = Write<unsigned_int>(_a_1->mIndices + a_2);
          c = uVar1 + c;
        }
      }
    }
  }
  else {
    local_48 = 0;
    while( true ) {
      hash = _old->mNumFaces - local_48;
      a = 0x200;
      puVar3 = std::min<unsigned_int>(&hash,&a);
      local_4c = *puVar3;
      if (local_4c == 0) break;
      local_58 = 0;
      for (f._4_4_ = 0; f._4_4_ < local_4c; f._4_4_ = f._4_4_ + 1) {
        _i = _old->mFaces + (local_48 + f._4_4_);
        i_1 = _i->mNumIndices;
        local_58 = SuperFastHash((char *)&i_1,4,local_58);
        for (local_70 = 0; local_70 < _i->mNumIndices; local_70 = local_70 + 1) {
          i_1 = _i->mIndices[local_70];
          local_58 = SuperFastHash((char *)&i_1,4,local_58);
        }
      }
      uVar1 = Write<unsigned_int>(&local_58);
      c = uVar1 + c;
      local_48 = local_4c + local_48;
    }
    local_4c = 0;
  }
  if (_old->mNumBones != 0) {
    for (b._0_4_ = 0; (uint)b < _old->mNumBones; b._0_4_ = (uint)b + 1) {
      uVar1 = WriteBinaryBone(_old->mBones[(uint)b]);
      c = uVar1 + 8 + c;
    }
  }
  ChangeInteger(n,c);
  return c;
}

Assistant:

uint32_t WriteBinaryMesh(const aiMesh* mesh)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMESH);

	len += Write<unsigned int>(mesh->mPrimitiveTypes);
	len += Write<unsigned int>(mesh->mNumVertices);
	len += Write<unsigned int>(mesh->mNumFaces);
	len += Write<unsigned int>(mesh->mNumBones);
	len += Write<unsigned int>(mesh->mMaterialIndex);

	// first of all, write bits for all existent vertex components
	unsigned int c = 0;
	if (mesh->mVertices) {
		c |= ASSBIN_MESH_HAS_POSITIONS;
	}
	if (mesh->mNormals) {
		c |= ASSBIN_MESH_HAS_NORMALS;
	}
	if (mesh->mTangents && mesh->mBitangents) {
		c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_TEXCOORD(n);
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_COLOR(n);
	}
	len += Write<unsigned int>(c);

	aiVector3D minVec, maxVec;
	if (mesh->mVertices) {
		if (shortened) {
			len += WriteBounds(mesh->mVertices,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mVertices,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mNormals) {
		if (shortened) {
			len += WriteBounds(mesh->mNormals,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mNormals,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mTangents && mesh->mBitangents) {
		if (shortened) {
			len += WriteBounds(mesh->mTangents,mesh->mNumVertices);
			len += WriteBounds(mesh->mBitangents,mesh->mNumVertices);
		} // else write as usual
		else {
			len += static_cast<uint32_t>(fwrite(mesh->mTangents,1,12*mesh->mNumVertices,out));
			len += static_cast<uint32_t>(fwrite(mesh->mBitangents,1,12*mesh->mNumVertices,out));
		}
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n])
			break;

		if (shortened) {
			len += WriteBounds(mesh->mColors[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mColors[n],16*mesh->mNumVertices,1,out));
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n])
			break;

		// write number of UV components
		len += Write<unsigned int>(mesh->mNumUVComponents[n]);

		if (shortened) {
			len += WriteBounds(mesh->mTextureCoords[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mTextureCoords[n],12*mesh->mNumVertices,1,out));
	}

	// write faces. There are no floating-point calculations involved
	// in these, so we can write a simple hash over the face data
	// to the dump file. We generate a single 32 Bit hash for 512 faces
	// using Assimp's standard hashing function.
	if (shortened) {
		unsigned int processed = 0;
		for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

			uint32_t hash = 0;
			for (unsigned int a = 0; a < job;++a) {

				const aiFace& f = mesh->mFaces[processed+a];
				uint32_t tmp = f.mNumIndices;
				hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				for (unsigned int i = 0; i < f.mNumIndices; ++i) {
					static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
					tmp = static_cast<uint32_t>( f.mIndices[i] );
					hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				}
			}
			len += Write<unsigned int>(hash);
		}
	}
	else // else write as usual
	{
		// if there are less than 2^16 vertices, we can simply use 16 bit integers ...
		for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
			const aiFace& f = mesh->mFaces[i];

			static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
			len += Write<uint16_t>(f.mNumIndices);

			for (unsigned int a = 0; a < f.mNumIndices;++a) {
				if (mesh->mNumVertices < (1u<<16)) {
					len += Write<uint16_t>(f.mIndices[a]);
				}
				else len += Write<unsigned int>(f.mIndices[a]);
			}
		}
	}

	// write bones
	if (mesh->mNumBones) {
		for (unsigned int a = 0; a < mesh->mNumBones;++a) {
			const aiBone* b = mesh->mBones[a];
			len += WriteBinaryBone(b)+8;
		}
	}

	ChangeInteger(old,len);
	return len;
}